

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregory_patch.h
# Opt level: O3

void __thiscall
embree::GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>::init_crackfix
          (GregoryPatchT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_> *this,
          CatmullClarkPatch *patch,BezierCurve *border0,BezierCurve *border1,BezierCurve *border2,
          BezierCurve *border3)

{
  vfloat_impl<4> *e0_p_vtx;
  vfloat_impl<4> *e1_m_vtx;
  vfloat_impl<4> *e1_m_vtx_00;
  vfloat_impl<4> *e0_p_vtx_00;
  vfloat_impl<4> *e1_m_vtx_01;
  int iVar1;
  uint uVar2;
  uint face_valence_p1;
  uint face_valence_p1_00;
  uint face_valence_p3;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  vfloat_impl<4> *pvVar9;
  ulong uVar10;
  vfloat_impl<4> *pvVar11;
  ulong uVar12;
  ulong uVar13;
  vfloat_impl<4> *pvVar14;
  float fVar15;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar22;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar23 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar24;
  undefined1 auVar25 [16];
  undefined1 auVar29 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar30;
  undefined1 auVar31 [16];
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  
  if (ABS((patch->ring).items[0].vertex_crease_weight) == INFINITY) {
    auVar34 = *(undefined1 (*) [16])(patch->ring).items[0].vtx.field_0.v;
  }
  else {
    iVar1 = (patch->ring).items[0].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[0].face_valence;
      if (uVar7 == 0) {
        fVar22 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar15 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
      }
      else {
        uVar10 = (ulong)(patch->ring).items[0].eval_start_index;
        pvVar11 = (patch->ring).items[0].ring.data + uVar10 * 2 + 1;
        fVar15 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        uVar12 = uVar7;
        do {
          uVar8 = uVar7;
          if (uVar10 < uVar7) {
            uVar8 = 0;
          }
          pvVar14 = pvVar11 + uVar8 * -2;
          fVar22 = fVar22 + (pvVar14->field_0).v[0];
          fVar26 = fVar26 + (pvVar14->field_0).v[1];
          fVar27 = fVar27 + (pvVar14->field_0).v[2];
          fVar28 = fVar28 + (pvVar14->field_0).v[3];
          pvVar14 = pvVar11 + uVar8 * -2 + -1;
          fVar15 = fVar15 + (pvVar14->field_0).v[0];
          fVar19 = fVar19 + (pvVar14->field_0).v[1];
          fVar20 = fVar20 + (pvVar14->field_0).v[2];
          fVar21 = fVar21 + (pvVar14->field_0).v[3];
          pvVar11 = pvVar11 + 2;
          uVar10 = uVar10 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        fVar15 = fVar15 * 4.0;
        fVar19 = fVar19 * 4.0;
        fVar20 = fVar20 * 4.0;
        fVar21 = fVar21 * 4.0;
      }
      fVar32 = (float)uVar7;
      auVar17._0_4_ = (fVar32 + 5.0) * fVar32;
      fVar32 = fVar32 * fVar32;
      auVar33._0_4_ = fVar32 * (patch->ring).items[0].vtx.field_0.v[0] + fVar15 + fVar22;
      auVar33._4_4_ = fVar32 * (patch->ring).items[0].vtx.field_0.v[1] + fVar19 + fVar26;
      auVar33._8_4_ = fVar32 * (patch->ring).items[0].vtx.field_0.v[2] + fVar20 + fVar27;
      auVar33._12_4_ = fVar32 * (patch->ring).items[0].vtx.field_0.v[3] + fVar21 + fVar28;
      auVar17._4_4_ = auVar17._0_4_;
      auVar17._8_4_ = auVar17._0_4_;
      auVar17._12_4_ = auVar17._0_4_;
      auVar34 = divps(auVar33,auVar17);
    }
    else {
      uVar7 = 0;
      if ((int)(iVar1 + 2U) < (int)(patch->ring).items[0].edge_valence) {
        uVar7 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[0].ring.data;
      pvVar11 = pvVar14 + iVar1;
      pvVar14 = pvVar14 + uVar7;
      auVar34._0_4_ =
           (pvVar11->field_0).v[0] + (pvVar14->field_0).v[0] +
           (patch->ring).items[0].vtx.field_0.v[0] * 4.0;
      auVar34._4_4_ =
           (pvVar11->field_0).v[1] + (pvVar14->field_0).v[1] +
           (patch->ring).items[0].vtx.field_0.v[1] * 4.0;
      auVar34._8_4_ =
           (pvVar11->field_0).v[2] + (pvVar14->field_0).v[2] +
           (patch->ring).items[0].vtx.field_0.v[2] * 4.0;
      auVar34._12_4_ =
           (pvVar11->field_0).v[3] + (pvVar14->field_0).v[3] +
           (patch->ring).items[0].vtx.field_0.v[3] * 4.0;
      auVar34 = divps(auVar34,_DAT_01f80e70);
    }
  }
  *(undefined1 (*) [16])this->v[0][0].field_0.v = auVar34;
  if (ABS((patch->ring).items[1].vertex_crease_weight) == INFINITY) {
    aVar30 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(patch->ring).items[1].vtx.field_0.v;
  }
  else {
    iVar1 = (patch->ring).items[1].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[1].face_valence;
      if (uVar7 == 0) {
        fVar22 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar15 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
      }
      else {
        uVar10 = (ulong)(patch->ring).items[1].eval_start_index;
        pvVar11 = (patch->ring).items[1].ring.data + uVar10 * 2 + 1;
        fVar15 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        uVar12 = uVar7;
        do {
          uVar8 = uVar7;
          if (uVar10 < uVar7) {
            uVar8 = 0;
          }
          pvVar14 = pvVar11 + uVar8 * -2;
          fVar15 = fVar15 + (pvVar14->field_0).v[0];
          fVar19 = fVar19 + (pvVar14->field_0).v[1];
          fVar20 = fVar20 + (pvVar14->field_0).v[2];
          fVar21 = fVar21 + (pvVar14->field_0).v[3];
          pvVar14 = pvVar11 + uVar8 * -2 + -1;
          fVar22 = fVar22 + (pvVar14->field_0).v[0];
          fVar26 = fVar26 + (pvVar14->field_0).v[1];
          fVar27 = fVar27 + (pvVar14->field_0).v[2];
          fVar28 = fVar28 + (pvVar14->field_0).v[3];
          pvVar11 = pvVar11 + 2;
          uVar10 = uVar10 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        fVar22 = fVar22 * 4.0;
        fVar26 = fVar26 * 4.0;
        fVar27 = fVar27 * 4.0;
        fVar28 = fVar28 * 4.0;
      }
      fVar32 = (float)uVar7;
      fVar35 = (fVar32 + 5.0) * fVar32;
      fVar32 = fVar32 * fVar32;
      auVar29._0_4_ = fVar32 * (patch->ring).items[1].vtx.field_0.v[0] + fVar22 + fVar15;
      auVar29._4_4_ = fVar32 * (patch->ring).items[1].vtx.field_0.v[1] + fVar26 + fVar19;
      auVar29._8_4_ = fVar32 * (patch->ring).items[1].vtx.field_0.v[2] + fVar27 + fVar20;
      auVar29._12_4_ = fVar32 * (patch->ring).items[1].vtx.field_0.v[3] + fVar28 + fVar21;
      auVar3._4_4_ = fVar35;
      auVar3._0_4_ = fVar35;
      auVar3._8_4_ = fVar35;
      auVar3._12_4_ = fVar35;
      aVar30 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(auVar29,auVar3);
    }
    else {
      uVar7 = 0;
      if ((int)(iVar1 + 2U) < (int)(patch->ring).items[1].edge_valence) {
        uVar7 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[1].ring.data;
      pvVar11 = pvVar14 + iVar1;
      pvVar14 = pvVar14 + uVar7;
      auVar31._0_4_ =
           (pvVar11->field_0).v[0] + (pvVar14->field_0).v[0] +
           (patch->ring).items[1].vtx.field_0.v[0] * 4.0;
      auVar31._4_4_ =
           (pvVar11->field_0).v[1] + (pvVar14->field_0).v[1] +
           (patch->ring).items[1].vtx.field_0.v[1] * 4.0;
      auVar31._8_4_ =
           (pvVar11->field_0).v[2] + (pvVar14->field_0).v[2] +
           (patch->ring).items[1].vtx.field_0.v[2] * 4.0;
      auVar31._12_4_ =
           (pvVar11->field_0).v[3] + (pvVar14->field_0).v[3] +
           (patch->ring).items[1].vtx.field_0.v[3] * 4.0;
      aVar30 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(auVar31,_DAT_01f80e70);
    }
  }
  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)this->v[0][3].field_0.v = aVar30;
  if (ABS((patch->ring).items[2].vertex_crease_weight) == INFINITY) {
    aVar24 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(patch->ring).items[2].vtx.field_0.v;
  }
  else {
    iVar1 = (patch->ring).items[2].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[2].face_valence;
      if (uVar7 == 0) {
        fVar22 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar15 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
      }
      else {
        uVar10 = (ulong)(patch->ring).items[2].eval_start_index;
        pvVar11 = (patch->ring).items[2].ring.data + uVar10 * 2 + 1;
        fVar15 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        uVar12 = uVar7;
        do {
          uVar8 = uVar7;
          if (uVar10 < uVar7) {
            uVar8 = 0;
          }
          pvVar14 = pvVar11 + uVar8 * -2;
          fVar15 = fVar15 + (pvVar14->field_0).v[0];
          fVar19 = fVar19 + (pvVar14->field_0).v[1];
          fVar20 = fVar20 + (pvVar14->field_0).v[2];
          fVar21 = fVar21 + (pvVar14->field_0).v[3];
          pvVar14 = pvVar11 + uVar8 * -2 + -1;
          fVar22 = fVar22 + (pvVar14->field_0).v[0];
          fVar26 = fVar26 + (pvVar14->field_0).v[1];
          fVar27 = fVar27 + (pvVar14->field_0).v[2];
          fVar28 = fVar28 + (pvVar14->field_0).v[3];
          pvVar11 = pvVar11 + 2;
          uVar10 = uVar10 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        fVar22 = fVar22 * 4.0;
        fVar26 = fVar26 * 4.0;
        fVar27 = fVar27 * 4.0;
        fVar28 = fVar28 * 4.0;
      }
      fVar32 = (float)uVar7;
      fVar35 = (fVar32 + 5.0) * fVar32;
      fVar32 = fVar32 * fVar32;
      auVar23._0_4_ = fVar32 * (patch->ring).items[2].vtx.field_0.v[0] + fVar22 + fVar15;
      auVar23._4_4_ = fVar32 * (patch->ring).items[2].vtx.field_0.v[1] + fVar26 + fVar19;
      auVar23._8_4_ = fVar32 * (patch->ring).items[2].vtx.field_0.v[2] + fVar27 + fVar20;
      auVar23._12_4_ = fVar32 * (patch->ring).items[2].vtx.field_0.v[3] + fVar28 + fVar21;
      auVar4._4_4_ = fVar35;
      auVar4._0_4_ = fVar35;
      auVar4._8_4_ = fVar35;
      auVar4._12_4_ = fVar35;
      aVar24 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(auVar23,auVar4);
    }
    else {
      uVar7 = 0;
      if ((int)(iVar1 + 2U) < (int)(patch->ring).items[2].edge_valence) {
        uVar7 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[2].ring.data;
      pvVar11 = pvVar14 + iVar1;
      pvVar14 = pvVar14 + uVar7;
      auVar25._0_4_ =
           (pvVar11->field_0).v[0] + (pvVar14->field_0).v[0] +
           (patch->ring).items[2].vtx.field_0.v[0] * 4.0;
      auVar25._4_4_ =
           (pvVar11->field_0).v[1] + (pvVar14->field_0).v[1] +
           (patch->ring).items[2].vtx.field_0.v[1] * 4.0;
      auVar25._8_4_ =
           (pvVar11->field_0).v[2] + (pvVar14->field_0).v[2] +
           (patch->ring).items[2].vtx.field_0.v[2] * 4.0;
      auVar25._12_4_ =
           (pvVar11->field_0).v[3] + (pvVar14->field_0).v[3] +
           (patch->ring).items[2].vtx.field_0.v[3] * 4.0;
      aVar24 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)divps(auVar25,_DAT_01f80e70);
    }
  }
  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)this->v[3][3].field_0.v = aVar24;
  if (ABS((patch->ring).items[3].vertex_crease_weight) == INFINITY) {
    auVar17 = *(undefined1 (*) [16])(patch->ring).items[3].vtx.field_0.v;
  }
  else {
    iVar1 = (patch->ring).items[3].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[3].face_valence;
      if (uVar7 == 0) {
        fVar22 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar15 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
      }
      else {
        uVar10 = (ulong)(patch->ring).items[3].eval_start_index;
        pvVar11 = (patch->ring).items[3].ring.data + uVar10 * 2 + 1;
        fVar15 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        uVar12 = uVar7;
        do {
          uVar8 = uVar7;
          if (uVar10 < uVar7) {
            uVar8 = 0;
          }
          pvVar14 = pvVar11 + uVar8 * -2;
          fVar15 = fVar15 + (pvVar14->field_0).v[0];
          fVar19 = fVar19 + (pvVar14->field_0).v[1];
          fVar20 = fVar20 + (pvVar14->field_0).v[2];
          fVar21 = fVar21 + (pvVar14->field_0).v[3];
          pvVar14 = pvVar11 + uVar8 * -2 + -1;
          fVar22 = fVar22 + (pvVar14->field_0).v[0];
          fVar26 = fVar26 + (pvVar14->field_0).v[1];
          fVar27 = fVar27 + (pvVar14->field_0).v[2];
          fVar28 = fVar28 + (pvVar14->field_0).v[3];
          pvVar11 = pvVar11 + 2;
          uVar10 = uVar10 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        fVar22 = fVar22 * 4.0;
        fVar26 = fVar26 * 4.0;
        fVar27 = fVar27 * 4.0;
        fVar28 = fVar28 * 4.0;
      }
      fVar32 = (float)uVar7;
      fVar35 = (fVar32 + 5.0) * fVar32;
      fVar32 = fVar32 * fVar32;
      auVar16._0_4_ = fVar32 * (patch->ring).items[3].vtx.field_0.v[0] + fVar22 + fVar15;
      auVar16._4_4_ = fVar32 * (patch->ring).items[3].vtx.field_0.v[1] + fVar26 + fVar19;
      auVar16._8_4_ = fVar32 * (patch->ring).items[3].vtx.field_0.v[2] + fVar27 + fVar20;
      auVar16._12_4_ = fVar32 * (patch->ring).items[3].vtx.field_0.v[3] + fVar28 + fVar21;
      auVar5._4_4_ = fVar35;
      auVar5._0_4_ = fVar35;
      auVar5._8_4_ = fVar35;
      auVar5._12_4_ = fVar35;
      auVar17 = divps(auVar16,auVar5);
    }
    else {
      uVar7 = 0;
      if ((int)(iVar1 + 2U) < (int)(patch->ring).items[3].edge_valence) {
        uVar7 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[3].ring.data;
      pvVar11 = pvVar14 + iVar1;
      pvVar14 = pvVar14 + uVar7;
      auVar18._0_4_ =
           (pvVar11->field_0).v[0] + (pvVar14->field_0).v[0] +
           (patch->ring).items[3].vtx.field_0.v[0] * 4.0;
      auVar18._4_4_ =
           (pvVar11->field_0).v[1] + (pvVar14->field_0).v[1] +
           (patch->ring).items[3].vtx.field_0.v[1] * 4.0;
      auVar18._8_4_ =
           (pvVar11->field_0).v[2] + (pvVar14->field_0).v[2] +
           (patch->ring).items[3].vtx.field_0.v[2] * 4.0;
      auVar18._12_4_ =
           (pvVar11->field_0).v[3] + (pvVar14->field_0).v[3] +
           (patch->ring).items[3].vtx.field_0.v[3] * 4.0;
      auVar17 = divps(auVar18,_DAT_01f80e70);
    }
  }
  *(undefined1 (*) [16])this->v[3][0].field_0.v = auVar17;
  if (ABS((patch->ring).items[0].vertex_crease_weight) == INFINITY) {
LAB_00d4aa88:
    pvVar11 = (patch->ring).items[0].ring.data;
    fVar19 = (pvVar11->field_0).v[0] - (patch->ring).items[0].vtx.field_0.v[0];
    fVar20 = (pvVar11->field_0).v[1] - (patch->ring).items[0].vtx.field_0.v[1];
    fVar21 = (pvVar11->field_0).v[2] - (patch->ring).items[0].vtx.field_0.v[2];
    fVar15 = (pvVar11->field_0).v[3] - (patch->ring).items[0].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[0].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[0].face_valence;
      if (uVar7 == 0) {
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
      }
      else {
        uVar10 = (ulong)(patch->ring).items[0].eval_start_index;
        pvVar11 = (patch->ring).items[0].ring.data + uVar10 * 2 + 1;
        fVar15 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        uVar12 = uVar7;
        do {
          uVar8 = uVar7;
          if (uVar10 < uVar7) {
            uVar8 = 0;
          }
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x108) + uVar8 * -4 + uVar10 * 4);
          fVar15 = fVar15 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[0];
          fVar26 = fVar26 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[1];
          fVar27 = fVar27 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[2];
          fVar28 = fVar28 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[3];
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x310) + uVar8 * -4 + uVar10 * 4);
          pvVar14 = pvVar11 + uVar8 * -2;
          fVar19 = fVar19 + fVar32 * (pvVar14->field_0).v[0];
          fVar20 = fVar20 + fVar32 * (pvVar14->field_0).v[1];
          fVar21 = fVar21 + fVar32 * (pvVar14->field_0).v[2];
          fVar22 = fVar22 + fVar32 * (pvVar14->field_0).v[3];
          pvVar11 = pvVar11 + 2;
          uVar10 = uVar10 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        fVar19 = fVar19 + fVar15;
        fVar20 = fVar20 + fVar26;
        fVar21 = fVar21 + fVar27;
        fVar22 = fVar22 + fVar28;
      }
      fVar15 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar19 = fVar15 * fVar19;
      fVar20 = fVar15 * fVar20;
      fVar21 = fVar15 * fVar21;
      fVar15 = fVar15 * fVar22;
    }
    else {
      uVar2 = (patch->ring).items[0].edge_valence;
      if (iVar1 != uVar2 - 2) goto LAB_00d4aa88;
      uVar7 = 0;
      if ((int)(iVar1 + 2U) < (int)uVar2) {
        uVar7 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[0].ring.data;
      pvVar11 = pvVar14 + uVar7;
      pvVar14 = pvVar14 + iVar1;
      fVar19 = ((pvVar11->field_0).v[0] - (pvVar14->field_0).v[0]) * 0.5;
      fVar20 = ((pvVar11->field_0).v[1] - (pvVar14->field_0).v[1]) * 0.5;
      fVar21 = ((pvVar11->field_0).v[2] - (pvVar14->field_0).v[2]) * 0.5;
      fVar15 = ((pvVar11->field_0).v[3] - (pvVar14->field_0).v[3]) * 0.5;
    }
  }
  this->v[0][1].field_0.v[0] = fVar19 * 0.33333334 + auVar34._0_4_;
  this->v[0][1].field_0.v[1] = fVar20 * 0.33333334 + auVar34._4_4_;
  this->v[0][1].field_0.v[2] = fVar21 * 0.33333334 + auVar34._8_4_;
  this->v[0][1].field_0.v[3] = fVar15 * 0.33333334 + auVar34._12_4_;
  if (ABS((patch->ring).items[1].vertex_crease_weight) == INFINITY) {
LAB_00d4aadb:
    pvVar11 = (patch->ring).items[1].ring.data;
    fVar19 = (pvVar11->field_0).v[0] - (patch->ring).items[1].vtx.field_0.v[0];
    fVar20 = (pvVar11->field_0).v[1] - (patch->ring).items[1].vtx.field_0.v[1];
    fVar21 = (pvVar11->field_0).v[2] - (patch->ring).items[1].vtx.field_0.v[2];
    fVar15 = (pvVar11->field_0).v[3] - (patch->ring).items[1].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[1].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[1].face_valence;
      if (uVar7 == 0) {
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
      }
      else {
        uVar10 = (ulong)(patch->ring).items[1].eval_start_index;
        pvVar11 = (patch->ring).items[1].ring.data + uVar10 * 2 + 1;
        fVar15 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        uVar12 = uVar7;
        do {
          uVar8 = uVar7;
          if (uVar10 < uVar7) {
            uVar8 = 0;
          }
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x108) + uVar8 * -4 + uVar10 * 4);
          fVar15 = fVar15 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[0];
          fVar26 = fVar26 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[1];
          fVar27 = fVar27 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[2];
          fVar28 = fVar28 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[3];
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x310) + uVar8 * -4 + uVar10 * 4);
          pvVar14 = pvVar11 + uVar8 * -2;
          fVar19 = fVar19 + fVar32 * (pvVar14->field_0).v[0];
          fVar20 = fVar20 + fVar32 * (pvVar14->field_0).v[1];
          fVar21 = fVar21 + fVar32 * (pvVar14->field_0).v[2];
          fVar22 = fVar22 + fVar32 * (pvVar14->field_0).v[3];
          pvVar11 = pvVar11 + 2;
          uVar10 = uVar10 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        fVar19 = fVar19 + fVar15;
        fVar20 = fVar20 + fVar26;
        fVar21 = fVar21 + fVar27;
        fVar22 = fVar22 + fVar28;
      }
      fVar15 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar19 = fVar15 * fVar19;
      fVar20 = fVar15 * fVar20;
      fVar21 = fVar15 * fVar21;
      fVar15 = fVar15 * fVar22;
    }
    else {
      uVar2 = (patch->ring).items[1].edge_valence;
      if (iVar1 != uVar2 - 2) goto LAB_00d4aadb;
      uVar7 = 0;
      if ((int)(iVar1 + 2U) < (int)uVar2) {
        uVar7 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[1].ring.data;
      pvVar11 = pvVar14 + uVar7;
      pvVar14 = pvVar14 + iVar1;
      fVar19 = ((pvVar11->field_0).v[0] - (pvVar14->field_0).v[0]) * 0.5;
      fVar20 = ((pvVar11->field_0).v[1] - (pvVar14->field_0).v[1]) * 0.5;
      fVar21 = ((pvVar11->field_0).v[2] - (pvVar14->field_0).v[2]) * 0.5;
      fVar15 = ((pvVar11->field_0).v[3] - (pvVar14->field_0).v[3]) * 0.5;
    }
  }
  this->v[1][3].field_0.v[0] = fVar19 * 0.33333334 + aVar30.v[0];
  this->v[1][3].field_0.v[1] = fVar20 * 0.33333334 + aVar30.v[1];
  this->v[1][3].field_0.v[2] = fVar21 * 0.33333334 + aVar30.v[2];
  this->v[1][3].field_0.v[3] = fVar15 * 0.33333334 + aVar30.v[3];
  if (ABS((patch->ring).items[2].vertex_crease_weight) == INFINITY) {
LAB_00d4ab2e:
    pvVar11 = (patch->ring).items[2].ring.data;
    fVar19 = (pvVar11->field_0).v[0] - (patch->ring).items[2].vtx.field_0.v[0];
    fVar20 = (pvVar11->field_0).v[1] - (patch->ring).items[2].vtx.field_0.v[1];
    fVar21 = (pvVar11->field_0).v[2] - (patch->ring).items[2].vtx.field_0.v[2];
    fVar15 = (pvVar11->field_0).v[3] - (patch->ring).items[2].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[2].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[2].face_valence;
      if (uVar7 == 0) {
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
      }
      else {
        uVar10 = (ulong)(patch->ring).items[2].eval_start_index;
        pvVar11 = (patch->ring).items[2].ring.data + uVar10 * 2 + 1;
        fVar15 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        uVar12 = uVar7;
        do {
          uVar8 = uVar7;
          if (uVar10 < uVar7) {
            uVar8 = 0;
          }
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x108) + uVar8 * -4 + uVar10 * 4);
          fVar15 = fVar15 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[0];
          fVar26 = fVar26 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[1];
          fVar27 = fVar27 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[2];
          fVar28 = fVar28 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[3];
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x310) + uVar8 * -4 + uVar10 * 4);
          pvVar14 = pvVar11 + uVar8 * -2;
          fVar19 = fVar19 + fVar32 * (pvVar14->field_0).v[0];
          fVar20 = fVar20 + fVar32 * (pvVar14->field_0).v[1];
          fVar21 = fVar21 + fVar32 * (pvVar14->field_0).v[2];
          fVar22 = fVar22 + fVar32 * (pvVar14->field_0).v[3];
          pvVar11 = pvVar11 + 2;
          uVar10 = uVar10 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        fVar19 = fVar19 + fVar15;
        fVar20 = fVar20 + fVar26;
        fVar21 = fVar21 + fVar27;
        fVar22 = fVar22 + fVar28;
      }
      fVar15 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar19 = fVar15 * fVar19;
      fVar20 = fVar15 * fVar20;
      fVar21 = fVar15 * fVar21;
      fVar15 = fVar15 * fVar22;
    }
    else {
      uVar2 = (patch->ring).items[2].edge_valence;
      if (iVar1 != uVar2 - 2) goto LAB_00d4ab2e;
      uVar7 = 0;
      if ((int)(iVar1 + 2U) < (int)uVar2) {
        uVar7 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[2].ring.data;
      pvVar11 = pvVar14 + uVar7;
      pvVar14 = pvVar14 + iVar1;
      fVar19 = ((pvVar11->field_0).v[0] - (pvVar14->field_0).v[0]) * 0.5;
      fVar20 = ((pvVar11->field_0).v[1] - (pvVar14->field_0).v[1]) * 0.5;
      fVar21 = ((pvVar11->field_0).v[2] - (pvVar14->field_0).v[2]) * 0.5;
      fVar15 = ((pvVar11->field_0).v[3] - (pvVar14->field_0).v[3]) * 0.5;
    }
  }
  this->v[3][2].field_0.v[0] = fVar19 * 0.33333334 + aVar24.v[0];
  this->v[3][2].field_0.v[1] = fVar20 * 0.33333334 + aVar24.v[1];
  this->v[3][2].field_0.v[2] = fVar21 * 0.33333334 + aVar24.v[2];
  this->v[3][2].field_0.v[3] = fVar15 * 0.33333334 + aVar24.v[3];
  if (ABS((patch->ring).items[3].vertex_crease_weight) == INFINITY) {
LAB_00d4ab81:
    pvVar11 = (patch->ring).items[3].ring.data;
    fVar19 = (pvVar11->field_0).v[0] - (patch->ring).items[3].vtx.field_0.v[0];
    fVar20 = (pvVar11->field_0).v[1] - (patch->ring).items[3].vtx.field_0.v[1];
    fVar21 = (pvVar11->field_0).v[2] - (patch->ring).items[3].vtx.field_0.v[2];
    fVar15 = (pvVar11->field_0).v[3] - (patch->ring).items[3].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[3].border_index;
    if ((long)iVar1 == -1) {
      uVar7 = (ulong)(patch->ring).items[3].face_valence;
      if (uVar7 == 0) {
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
      }
      else {
        uVar10 = (ulong)(patch->ring).items[3].eval_start_index;
        pvVar11 = (patch->ring).items[3].ring.data + uVar10 * 2 + 1;
        fVar15 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        uVar12 = uVar7;
        do {
          uVar8 = uVar7;
          if (uVar10 < uVar7) {
            uVar8 = 0;
          }
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x108) + uVar8 * -4 + uVar10 * 4);
          fVar15 = fVar15 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[0];
          fVar26 = fVar26 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[1];
          fVar27 = fVar27 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[2];
          fVar28 = fVar28 + fVar32 * pvVar11[uVar8 * -2 + -1].field_0.v[3];
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x310) + uVar8 * -4 + uVar10 * 4);
          pvVar14 = pvVar11 + uVar8 * -2;
          fVar19 = fVar19 + fVar32 * (pvVar14->field_0).v[0];
          fVar20 = fVar20 + fVar32 * (pvVar14->field_0).v[1];
          fVar21 = fVar21 + fVar32 * (pvVar14->field_0).v[2];
          fVar22 = fVar22 + fVar32 * (pvVar14->field_0).v[3];
          pvVar11 = pvVar11 + 2;
          uVar10 = uVar10 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        fVar19 = fVar19 + fVar15;
        fVar20 = fVar20 + fVar26;
        fVar21 = fVar21 + fVar27;
        fVar22 = fVar22 + fVar28;
      }
      fVar15 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar19 = fVar15 * fVar19;
      fVar20 = fVar15 * fVar20;
      fVar21 = fVar15 * fVar21;
      fVar15 = fVar15 * fVar22;
    }
    else {
      uVar2 = (patch->ring).items[3].edge_valence;
      if (iVar1 != uVar2 - 2) goto LAB_00d4ab81;
      uVar7 = 0;
      if ((int)(iVar1 + 2U) < (int)uVar2) {
        uVar7 = (ulong)(iVar1 + 2U);
      }
      pvVar14 = (patch->ring).items[3].ring.data;
      pvVar11 = pvVar14 + uVar7;
      pvVar14 = pvVar14 + iVar1;
      fVar19 = ((pvVar11->field_0).v[0] - (pvVar14->field_0).v[0]) * 0.5;
      fVar20 = ((pvVar11->field_0).v[1] - (pvVar14->field_0).v[1]) * 0.5;
      fVar21 = ((pvVar11->field_0).v[2] - (pvVar14->field_0).v[2]) * 0.5;
      fVar15 = ((pvVar11->field_0).v[3] - (pvVar14->field_0).v[3]) * 0.5;
    }
  }
  this->v[2][0].field_0.v[0] = fVar19 * 0.33333334 + auVar17._0_4_;
  this->v[2][0].field_0.v[1] = fVar20 * 0.33333334 + auVar17._4_4_;
  this->v[2][0].field_0.v[2] = fVar21 * 0.33333334 + auVar17._8_4_;
  this->v[2][0].field_0.v[3] = fVar15 * 0.33333334 + auVar17._12_4_;
  if (ABS((patch->ring).items[0].vertex_crease_weight) == INFINITY) {
LAB_00d4abc3:
    pvVar11 = (patch->ring).items[0].ring.data;
    fVar19 = pvVar11[2].field_0.v[0] - (patch->ring).items[0].vtx.field_0.v[0];
    fVar20 = pvVar11[2].field_0.v[1] - (patch->ring).items[0].vtx.field_0.v[1];
    fVar21 = pvVar11[2].field_0.v[2] - (patch->ring).items[0].vtx.field_0.v[2];
    fVar15 = pvVar11[2].field_0.v[3] - (patch->ring).items[0].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[0].border_index;
    if (iVar1 == -1) {
      uVar2 = (patch->ring).items[0].face_valence;
      uVar7 = (ulong)uVar2;
      if (uVar7 == 0) {
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
      }
      else {
        uVar10 = (ulong)(patch->ring).items[0].eval_start_index;
        pvVar11 = (patch->ring).items[0].ring.data + uVar10 * 2 + 1;
        fVar15 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        uVar12 = uVar7;
        do {
          uVar8 = uVar7;
          if (uVar10 < uVar7) {
            uVar8 = 0;
          }
          uVar13 = ~uVar8 + uVar10;
          if (uVar10 == uVar8) {
            uVar13 = (ulong)(uVar2 - 1);
          }
          pvVar9 = pvVar11 + uVar8 * -2;
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x108) + uVar13 * 4);
          pvVar14 = pvVar11 + uVar8 * -2 + -1;
          fVar15 = fVar15 + fVar32 * (pvVar14->field_0).v[0];
          fVar26 = fVar26 + fVar32 * (pvVar14->field_0).v[1];
          fVar27 = fVar27 + fVar32 * (pvVar14->field_0).v[2];
          fVar28 = fVar28 + fVar32 * (pvVar14->field_0).v[3];
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x310) + uVar13 * 4);
          fVar19 = fVar19 + fVar32 * (pvVar9->field_0).v[0];
          fVar20 = fVar20 + fVar32 * (pvVar9->field_0).v[1];
          fVar21 = fVar21 + fVar32 * (pvVar9->field_0).v[2];
          fVar22 = fVar22 + fVar32 * (pvVar9->field_0).v[3];
          uVar10 = uVar10 + 1;
          pvVar11 = pvVar11 + 2;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        fVar19 = fVar19 + fVar15;
        fVar20 = fVar20 + fVar26;
        fVar21 = fVar21 + fVar27;
        fVar22 = fVar22 + fVar28;
      }
      fVar15 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar19 = fVar15 * fVar19;
      fVar20 = fVar15 * fVar20;
      fVar21 = fVar15 * fVar21;
      fVar15 = fVar15 * fVar22;
    }
    else {
      if (iVar1 != 2) goto LAB_00d4abc3;
      pvVar14 = (patch->ring).items[0].ring.data;
      pvVar11 = pvVar14 + (ulong)(4 < (int)(patch->ring).items[0].edge_valence) * 4;
      fVar19 = (pvVar14[2].field_0.v[0] - (pvVar11->field_0).v[0]) * 0.5;
      fVar20 = (pvVar14[2].field_0.v[1] - (pvVar11->field_0).v[1]) * 0.5;
      fVar21 = (pvVar14[2].field_0.v[2] - (pvVar11->field_0).v[2]) * 0.5;
      fVar15 = (pvVar14[2].field_0.v[3] - (pvVar11->field_0).v[3]) * 0.5;
    }
  }
  this->v[1][0].field_0.v[0] = auVar34._0_4_ + fVar19 * 0.33333334;
  this->v[1][0].field_0.v[1] = auVar34._4_4_ + fVar20 * 0.33333334;
  this->v[1][0].field_0.v[2] = auVar34._8_4_ + fVar21 * 0.33333334;
  this->v[1][0].field_0.v[3] = auVar34._12_4_ + fVar15 * 0.33333334;
  if (ABS((patch->ring).items[1].vertex_crease_weight) == INFINITY) {
LAB_00d4ac09:
    pvVar11 = (patch->ring).items[1].ring.data;
    fVar19 = pvVar11[2].field_0.v[0] - (patch->ring).items[1].vtx.field_0.v[0];
    fVar20 = pvVar11[2].field_0.v[1] - (patch->ring).items[1].vtx.field_0.v[1];
    fVar21 = pvVar11[2].field_0.v[2] - (patch->ring).items[1].vtx.field_0.v[2];
    fVar15 = pvVar11[2].field_0.v[3] - (patch->ring).items[1].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[1].border_index;
    if (iVar1 == -1) {
      uVar2 = (patch->ring).items[1].face_valence;
      uVar7 = (ulong)uVar2;
      if (uVar7 == 0) {
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
      }
      else {
        uVar10 = (ulong)(patch->ring).items[1].eval_start_index;
        pvVar11 = (patch->ring).items[1].ring.data + uVar10 * 2 + 1;
        fVar15 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        uVar12 = uVar7;
        do {
          uVar8 = uVar7;
          if (uVar10 < uVar7) {
            uVar8 = 0;
          }
          uVar13 = ~uVar8 + uVar10;
          if (uVar10 == uVar8) {
            uVar13 = (ulong)(uVar2 - 1);
          }
          pvVar9 = pvVar11 + uVar8 * -2;
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x108) + uVar13 * 4);
          pvVar14 = pvVar11 + uVar8 * -2 + -1;
          fVar15 = fVar15 + fVar32 * (pvVar14->field_0).v[0];
          fVar26 = fVar26 + fVar32 * (pvVar14->field_0).v[1];
          fVar27 = fVar27 + fVar32 * (pvVar14->field_0).v[2];
          fVar28 = fVar28 + fVar32 * (pvVar14->field_0).v[3];
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x310) + uVar13 * 4);
          fVar19 = fVar19 + fVar32 * (pvVar9->field_0).v[0];
          fVar20 = fVar20 + fVar32 * (pvVar9->field_0).v[1];
          fVar21 = fVar21 + fVar32 * (pvVar9->field_0).v[2];
          fVar22 = fVar22 + fVar32 * (pvVar9->field_0).v[3];
          uVar10 = uVar10 + 1;
          pvVar11 = pvVar11 + 2;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        fVar19 = fVar19 + fVar15;
        fVar20 = fVar20 + fVar26;
        fVar21 = fVar21 + fVar27;
        fVar22 = fVar22 + fVar28;
      }
      fVar15 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar19 = fVar15 * fVar19;
      fVar20 = fVar15 * fVar20;
      fVar21 = fVar15 * fVar21;
      fVar15 = fVar15 * fVar22;
    }
    else {
      if (iVar1 != 2) goto LAB_00d4ac09;
      pvVar14 = (patch->ring).items[1].ring.data;
      pvVar11 = pvVar14 + (ulong)(4 < (int)(patch->ring).items[1].edge_valence) * 4;
      fVar19 = (pvVar14[2].field_0.v[0] - (pvVar11->field_0).v[0]) * 0.5;
      fVar20 = (pvVar14[2].field_0.v[1] - (pvVar11->field_0).v[1]) * 0.5;
      fVar21 = (pvVar14[2].field_0.v[2] - (pvVar11->field_0).v[2]) * 0.5;
      fVar15 = (pvVar14[2].field_0.v[3] - (pvVar11->field_0).v[3]) * 0.5;
    }
  }
  this->v[0][2].field_0.v[0] = aVar30.v[0] + fVar19 * 0.33333334;
  this->v[0][2].field_0.v[1] = aVar30.v[1] + fVar20 * 0.33333334;
  this->v[0][2].field_0.v[2] = aVar30.v[2] + fVar21 * 0.33333334;
  this->v[0][2].field_0.v[3] = aVar30.v[3] + fVar15 * 0.33333334;
  if (ABS((patch->ring).items[2].vertex_crease_weight) != INFINITY) {
    iVar1 = (patch->ring).items[2].border_index;
    if (iVar1 == -1) {
      uVar2 = (patch->ring).items[2].face_valence;
      uVar7 = (ulong)uVar2;
      if (uVar7 == 0) {
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
      }
      else {
        uVar10 = (ulong)(patch->ring).items[2].eval_start_index;
        pvVar11 = (patch->ring).items[2].ring.data + uVar10 * 2 + 1;
        fVar15 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        uVar12 = uVar7;
        do {
          uVar8 = uVar7;
          if (uVar10 < uVar7) {
            uVar8 = 0;
          }
          uVar13 = ~uVar8 + uVar10;
          if (uVar10 == uVar8) {
            uVar13 = (ulong)(uVar2 - 1);
          }
          pvVar9 = pvVar11 + uVar8 * -2;
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x108) + uVar13 * 4);
          pvVar14 = pvVar11 + uVar8 * -2 + -1;
          fVar15 = fVar15 + fVar32 * (pvVar14->field_0).v[0];
          fVar26 = fVar26 + fVar32 * (pvVar14->field_0).v[1];
          fVar27 = fVar27 + fVar32 * (pvVar14->field_0).v[2];
          fVar28 = fVar28 + fVar32 * (pvVar14->field_0).v[3];
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x310) + uVar13 * 4);
          fVar19 = fVar19 + fVar32 * (pvVar9->field_0).v[0];
          fVar20 = fVar20 + fVar32 * (pvVar9->field_0).v[1];
          fVar21 = fVar21 + fVar32 * (pvVar9->field_0).v[2];
          fVar22 = fVar22 + fVar32 * (pvVar9->field_0).v[3];
          uVar10 = uVar10 + 1;
          pvVar11 = pvVar11 + 2;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        fVar19 = fVar19 + fVar15;
        fVar20 = fVar20 + fVar26;
        fVar21 = fVar21 + fVar27;
        fVar22 = fVar22 + fVar28;
      }
      fVar15 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar19 = fVar15 * fVar19;
      fVar20 = fVar15 * fVar20;
      fVar21 = fVar15 * fVar21;
      fVar15 = fVar15 * fVar22;
      goto LAB_00d4a55d;
    }
    if (iVar1 == 2) {
      pvVar14 = (patch->ring).items[2].ring.data;
      pvVar11 = pvVar14 + (ulong)(4 < (int)(patch->ring).items[2].edge_valence) * 4;
      fVar19 = (pvVar14[2].field_0.v[0] - (pvVar11->field_0).v[0]) * 0.5;
      fVar20 = (pvVar14[2].field_0.v[1] - (pvVar11->field_0).v[1]) * 0.5;
      fVar21 = (pvVar14[2].field_0.v[2] - (pvVar11->field_0).v[2]) * 0.5;
      fVar15 = (pvVar14[2].field_0.v[3] - (pvVar11->field_0).v[3]) * 0.5;
      goto LAB_00d4a55d;
    }
  }
  pvVar11 = (patch->ring).items[2].ring.data;
  fVar19 = pvVar11[2].field_0.v[0] - (patch->ring).items[2].vtx.field_0.v[0];
  fVar20 = pvVar11[2].field_0.v[1] - (patch->ring).items[2].vtx.field_0.v[1];
  fVar21 = pvVar11[2].field_0.v[2] - (patch->ring).items[2].vtx.field_0.v[2];
  fVar15 = pvVar11[2].field_0.v[3] - (patch->ring).items[2].vtx.field_0.v[3];
LAB_00d4a55d:
  this->v[2][3].field_0.v[0] = aVar24.v[0] + fVar19 * 0.33333334;
  this->v[2][3].field_0.v[1] = aVar24.v[1] + fVar20 * 0.33333334;
  this->v[2][3].field_0.v[2] = aVar24.v[2] + fVar21 * 0.33333334;
  this->v[2][3].field_0.v[3] = aVar24.v[3] + fVar15 * 0.33333334;
  if (ABS((patch->ring).items[3].vertex_crease_weight) == INFINITY) {
    pvVar11 = (patch->ring).items[3].ring.data;
    fVar19 = pvVar11[2].field_0.v[0] - (patch->ring).items[3].vtx.field_0.v[0];
    fVar20 = pvVar11[2].field_0.v[1] - (patch->ring).items[3].vtx.field_0.v[1];
    fVar21 = pvVar11[2].field_0.v[2] - (patch->ring).items[3].vtx.field_0.v[2];
    fVar15 = pvVar11[2].field_0.v[3] - (patch->ring).items[3].vtx.field_0.v[3];
  }
  else {
    iVar1 = (patch->ring).items[3].border_index;
    if (iVar1 == -1) {
      uVar2 = (patch->ring).items[3].face_valence;
      uVar7 = (ulong)uVar2;
      if (uVar7 == 0) {
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
      }
      else {
        uVar10 = (ulong)(patch->ring).items[3].eval_start_index;
        pvVar11 = (patch->ring).items[3].ring.data + uVar10 * 2 + 1;
        fVar15 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        uVar12 = uVar7;
        do {
          uVar8 = uVar7;
          if (uVar10 < uVar7) {
            uVar8 = 0;
          }
          uVar13 = ~uVar8 + uVar10;
          if (uVar10 == uVar8) {
            uVar13 = (ulong)(uVar2 - 1);
          }
          pvVar9 = pvVar11 + uVar8 * -2;
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x108) + uVar13 * 4);
          pvVar14 = pvVar11 + uVar8 * -2 + -1;
          fVar15 = fVar15 + fVar32 * (pvVar14->field_0).v[0];
          fVar26 = fVar26 + fVar32 * (pvVar14->field_0).v[1];
          fVar27 = fVar27 + fVar32 * (pvVar14->field_0).v[2];
          fVar28 = fVar28 + fVar32 * (pvVar14->field_0).v[3];
          fVar32 = *(float *)(*(long *)(CatmullClarkPrecomputedCoefficients::table +
                                       uVar7 * 8 + 0x310) + uVar13 * 4);
          fVar19 = fVar19 + fVar32 * (pvVar9->field_0).v[0];
          fVar20 = fVar20 + fVar32 * (pvVar9->field_0).v[1];
          fVar21 = fVar21 + fVar32 * (pvVar9->field_0).v[2];
          fVar22 = fVar22 + fVar32 * (pvVar9->field_0).v[3];
          uVar10 = uVar10 + 1;
          pvVar11 = pvVar11 + 2;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
        fVar19 = fVar19 + fVar15;
        fVar20 = fVar20 + fVar26;
        fVar21 = fVar21 + fVar27;
        fVar22 = fVar22 + fVar28;
      }
      fVar15 = *(float *)(CatmullClarkPrecomputedCoefficients::table + uVar7 * 4 + 0x518);
      fVar19 = fVar15 * fVar19;
      fVar20 = fVar15 * fVar20;
      fVar21 = fVar15 * fVar21;
      fVar15 = fVar15 * fVar22;
    }
    else if (iVar1 == 2) {
      pvVar14 = (patch->ring).items[3].ring.data;
      pvVar11 = pvVar14 + (ulong)(4 < (int)(patch->ring).items[3].edge_valence) * 4;
      fVar19 = (pvVar14[2].field_0.v[0] - (pvVar11->field_0).v[0]) * 0.5;
      fVar20 = (pvVar14[2].field_0.v[1] - (pvVar11->field_0).v[1]) * 0.5;
      fVar21 = (pvVar14[2].field_0.v[2] - (pvVar11->field_0).v[2]) * 0.5;
      fVar15 = (pvVar14[2].field_0.v[3] - (pvVar11->field_0).v[3]) * 0.5;
    }
    else {
      pvVar11 = (patch->ring).items[3].ring.data;
      fVar19 = pvVar11[2].field_0.v[0] - (patch->ring).items[3].vtx.field_0.v[0];
      fVar20 = pvVar11[2].field_0.v[1] - (patch->ring).items[3].vtx.field_0.v[1];
      fVar21 = pvVar11[2].field_0.v[2] - (patch->ring).items[3].vtx.field_0.v[2];
      fVar15 = pvVar11[2].field_0.v[3] - (patch->ring).items[3].vtx.field_0.v[3];
    }
  }
  this->v[3][1].field_0.v[0] = auVar17._0_4_ + fVar19 * 0.33333334;
  this->v[3][1].field_0.v[1] = auVar17._4_4_ + fVar20 * 0.33333334;
  this->v[3][1].field_0.v[2] = auVar17._8_4_ + fVar21 * 0.33333334;
  this->v[3][1].field_0.v[3] = auVar17._12_4_ + fVar15 * 0.33333334;
  if (border0 != (BezierCurve *)0x0) {
    uVar6 = *(undefined8 *)((long)&(border0->v0).field_0 + 8);
    *(undefined8 *)&this->v[0][0].field_0 = *(undefined8 *)&(border0->v0).field_0;
    *(undefined8 *)((long)&this->v[0][0].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border0->v1).field_0 + 8);
    *(undefined8 *)&this->v[0][1].field_0 = *(undefined8 *)&(border0->v1).field_0;
    *(undefined8 *)((long)&this->v[0][1].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border0->v2).field_0 + 8);
    *(undefined8 *)&this->v[0][2].field_0 = *(undefined8 *)&(border0->v2).field_0;
    *(undefined8 *)((long)&this->v[0][2].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border0->v3).field_0 + 8);
    *(undefined8 *)&this->v[0][3].field_0 = *(undefined8 *)&(border0->v3).field_0;
    *(undefined8 *)((long)&this->v[0][3].field_0 + 8) = uVar6;
  }
  pvVar11 = this->v[0] + 3;
  pvVar9 = this->v[3] + 3;
  pvVar14 = this->v[1] + 3;
  e1_m_vtx_00 = this->v[2] + 3;
  if (border1 != (BezierCurve *)0x0) {
    uVar6 = *(undefined8 *)((long)&(border1->v0).field_0 + 8);
    *(undefined8 *)&pvVar11->field_0 = *(undefined8 *)&(border1->v0).field_0;
    *(undefined8 *)((long)&this->v[0][3].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border1->v1).field_0 + 8);
    *(undefined8 *)&pvVar14->field_0 = *(undefined8 *)&(border1->v1).field_0;
    *(undefined8 *)((long)&this->v[1][3].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border1->v2).field_0 + 8);
    *(undefined8 *)&e1_m_vtx_00->field_0 = *(undefined8 *)&(border1->v2).field_0;
    *(undefined8 *)((long)&this->v[2][3].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border1->v3).field_0 + 8);
    *(undefined8 *)&pvVar9->field_0 = *(undefined8 *)&(border1->v3).field_0;
    *(undefined8 *)((long)&this->v[3][3].field_0 + 8) = uVar6;
  }
  e0_p_vtx_00 = this->v[3] + 2;
  e1_m_vtx_01 = this->v[3] + 1;
  if (border2 != (BezierCurve *)0x0) {
    uVar6 = *(undefined8 *)((long)&(border2->v0).field_0 + 8);
    *(undefined8 *)&pvVar9->field_0 = *(undefined8 *)&(border2->v0).field_0;
    *(undefined8 *)((long)&this->v[3][3].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border2->v1).field_0 + 8);
    *(undefined8 *)&e0_p_vtx_00->field_0 = *(undefined8 *)&(border2->v1).field_0;
    *(undefined8 *)((long)&this->v[3][2].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border2->v2).field_0 + 8);
    *(undefined8 *)&e1_m_vtx_01->field_0 = *(undefined8 *)&(border2->v2).field_0;
    *(undefined8 *)((long)&this->v[3][1].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border2->v3).field_0 + 8);
    *(undefined8 *)&this->v[3][0].field_0 = *(undefined8 *)&(border2->v3).field_0;
    *(undefined8 *)((long)&this->v[3][0].field_0 + 8) = uVar6;
  }
  e0_p_vtx = this->v[0] + 1;
  e1_m_vtx = this->v[0] + 2;
  if (border3 != (BezierCurve *)0x0) {
    uVar6 = *(undefined8 *)((long)&(border3->v0).field_0 + 8);
    *(undefined8 *)&this->v[3][0].field_0 = *(undefined8 *)&(border3->v0).field_0;
    *(undefined8 *)((long)&this->v[3][0].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border3->v1).field_0 + 8);
    *(undefined8 *)&this->v[2][0].field_0 = *(undefined8 *)&(border3->v1).field_0;
    *(undefined8 *)((long)&this->v[2][0].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border3->v2).field_0 + 8);
    *(undefined8 *)&this->v[1][0].field_0 = *(undefined8 *)&(border3->v2).field_0;
    *(undefined8 *)((long)&this->v[1][0].field_0 + 8) = uVar6;
    uVar6 = *(undefined8 *)((long)&(border3->v3).field_0 + 8);
    *(undefined8 *)&this->v[0][0].field_0 = *(undefined8 *)&(border3->v3).field_0;
    *(undefined8 *)((long)&this->v[0][0].field_0 + 8) = uVar6;
  }
  uVar2 = (patch->ring).items[0].face_valence;
  face_valence_p1 = (patch->ring).items[1].face_valence;
  face_valence_p1_00 = (patch->ring).items[2].face_valence;
  face_valence_p3 = (patch->ring).items[3].face_valence;
  initFaceVertex(this,patch,0,(vfloat_impl<4> *)this,e0_p_vtx,e1_m_vtx,face_valence_p1,this->v[1],
                 this->v[2],face_valence_p3,this->v[1] + 1,this->f[0]);
  initFaceVertex(this,patch,1,pvVar11,pvVar14,e1_m_vtx_00,face_valence_p1_00,e1_m_vtx,e0_p_vtx,uVar2
                 ,this->v[1] + 2,this->f[0] + 1);
  initFaceVertex(this,patch,2,pvVar9,e0_p_vtx_00,e1_m_vtx_01,face_valence_p3,e1_m_vtx_00,pvVar14,
                 face_valence_p1,this->v[2] + 2,this->f[1] + 1);
  initFaceVertex(this,patch,3,this->v[3],this->v[2],this->v[1],uVar2,e1_m_vtx_01,e0_p_vtx_00,
                 face_valence_p3,this->v[2] + 1,this->f[1]);
  return;
}

Assistant:

__noinline void init_crackfix(const CatmullClarkPatch& patch, 
                                  const BezierCurve* border0, 
                                  const BezierCurve* border1,
                                  const BezierCurve* border2, 
                                  const BezierCurve* border3)
    {
      assert( patch.ring[0].hasValidPositions() );
      assert( patch.ring[1].hasValidPositions() );
      assert( patch.ring[2].hasValidPositions() );
      assert( patch.ring[3].hasValidPositions() );
      
      p0() = initCornerVertex(patch,0);
      p1() = initCornerVertex(patch,1);
      p2() = initCornerVertex(patch,2);
      p3() = initCornerVertex(patch,3);

      e0_p() = initPositiveEdgeVertex(patch,0, p0());
      e1_p() = initPositiveEdgeVertex(patch,1, p1());
      e2_p() = initPositiveEdgeVertex(patch,2, p2());
      e3_p() = initPositiveEdgeVertex(patch,3, p3());

      e0_m() = initNegativeEdgeVertex(patch,0, p0());
      e1_m() = initNegativeEdgeVertex(patch,1, p1());
      e2_m() = initNegativeEdgeVertex(patch,2, p2());
      e3_m() = initNegativeEdgeVertex(patch,3, p3());

      if (unlikely(border0 != nullptr)) 
      {         
        p0()   = border0->v0;
        e0_p() = border0->v1; 
        e1_m() = border0->v2; 
        p1()   = border0->v3;
      }
      
      if (unlikely(border1 != nullptr))
      {          
        p1()   = border1->v0; 
        e1_p() = border1->v1; 
        e2_m() = border1->v2; 
        p2()   = border1->v3; 
      }

      if (unlikely(border2 != nullptr))
      {          
        p2()   = border2->v0; 
        e2_p() = border2->v1; 
        e3_m() = border2->v2; 
        p3()   = border2->v3; 
      }

      if (unlikely(border3 != nullptr))
      {          
        p3()   = border3->v0; 
        e3_p() = border3->v1; 
        e0_m() = border3->v2; 
        p0()   = border3->v3; 
      }

      const unsigned int face_valence_p0 = patch.ring[0].face_valence;
      const unsigned int face_valence_p1 = patch.ring[1].face_valence;
      const unsigned int face_valence_p2 = patch.ring[2].face_valence;
      const unsigned int face_valence_p3 = patch.ring[3].face_valence;
      
      initFaceVertex(patch,0,p0(),e0_p(),e1_m(),face_valence_p1,e0_m(),e3_p(),face_valence_p3,f0_p(),f0_m() );
      initFaceVertex(patch,1,p1(),e1_p(),e2_m(),face_valence_p2,e1_m(),e0_p(),face_valence_p0,f1_p(),f1_m() );
      initFaceVertex(patch,2,p2(),e2_p(),e3_m(),face_valence_p3,e2_m(),e1_p(),face_valence_p1,f2_p(),f2_m() );
      initFaceVertex(patch,3,p3(),e3_p(),e0_m(),face_valence_p0,e3_m(),e2_p(),face_valence_p3,f3_p(),f3_m() );
    }